

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O2

Bit32u __thiscall OPL::DOSBox::DBOPL::Chip::ForwardNoise(Chip *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  
  uVar3 = this->noiseValue;
  uVar2 = this->noiseCounter + this->noiseAdd;
  uVar1 = uVar2 >> 0xc;
  this->noiseCounter = uVar2 & 0x3fffff;
  while (bVar4 = uVar1 != 0, uVar1 = uVar1 - 1, bVar4) {
    uVar3 = (-(uVar3 & 1) & 0x800302 ^ uVar3) >> 1;
    this->noiseValue = uVar3;
  }
  return uVar3;
}

Assistant:

INLINE Bit32u Chip::ForwardNoise() {
	noiseCounter += noiseAdd;
	Bitu count = noiseCounter >> LFO_SH;
	noiseCounter &= WAVE_MASK;
	for ( ; count > 0; --count ) {
		//Noise calculation from mame
		noiseValue ^= ( 0x800302 ) & ( 0 - (noiseValue & 1 ) );
		noiseValue >>= 1;
	}
	return noiseValue;
}